

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O1

void VP8EncInitAlpha(VP8Encoder *enc)

{
  int iVar1;
  WebPWorkerInterface *pWVar2;
  
  WebPInitAlphaProcessing();
  iVar1 = WebPPictureHasTransparency(enc->pic_);
  enc->has_alpha_ = iVar1;
  enc->alpha_data_ = (uint8_t *)0x0;
  enc->alpha_data_size_ = 0;
  if (0 < enc->thread_level_) {
    pWVar2 = WebPGetWorkerInterface();
    (*pWVar2->Init)(&enc->alpha_worker_);
    (enc->alpha_worker_).data1 = enc;
    (enc->alpha_worker_).data2 = (void *)0x0;
    (enc->alpha_worker_).hook = CompressAlphaJob;
  }
  return;
}

Assistant:

void VP8EncInitAlpha(VP8Encoder* const enc) {
  WebPInitAlphaProcessing();
  enc->has_alpha_ = WebPPictureHasTransparency(enc->pic_);
  enc->alpha_data_ = NULL;
  enc->alpha_data_size_ = 0;
  if (enc->thread_level_ > 0) {
    WebPWorker* const worker = &enc->alpha_worker_;
    WebPGetWorkerInterface()->Init(worker);
    worker->data1 = enc;
    worker->data2 = NULL;
    worker->hook = CompressAlphaJob;
  }
}